

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

RTPTransmissionInfo * __thiscall
jrtplib::RTPFakeTransmitter::GetTransmissionInfo(RTPFakeTransmitter *this)

{
  RTPMemoryManager *mgr;
  RTPFakeTransmitter *this_00;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  RTPTransmissionInfo *tinf;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local = (RTPFakeTransmitter *)0x0;
  }
  else {
    tinf = (RTPTransmissionInfo *)this;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    this_00 = (RTPFakeTransmitter *)operator_new(0x30,mgr,0x1c);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&local_38,&this->localIPs)
    ;
    RTPFakeTransmissionInfo::RTPFakeTransmissionInfo
              ((RTPFakeTransmissionInfo *)this_00,&local_38,this->params);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list(&local_38);
    this_local = this_00;
  }
  return (RTPTransmissionInfo *)this_local;
}

Assistant:

RTPTransmissionInfo *RTPFakeTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPFakeTransmissionInfo(localIPs, params);
	MAINMUTEX_UNLOCK
	return tinf;
}